

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSoftBody.cpp
# Opt level: O2

void __thiscall btSoftBody::dampClusters(btSoftBody *this)

{
  float fVar1;
  Cluster *pCVar2;
  Node *pNVar3;
  long lVar4;
  int j;
  long lVar5;
  btVector3 *this_00;
  btScalar bVar6;
  btScalar bVar7;
  btVector3 bVar8;
  btVector3 vx;
  btVector3 local_60;
  btVector3 local_50;
  btVector3 local_40;
  
  for (lVar4 = 0; lVar4 < (this->m_clusters).m_size; lVar4 = lVar4 + 1) {
    pCVar2 = (this->m_clusters).m_data[lVar4];
    if (0.0 < pCVar2->m_ndamping) {
      for (lVar5 = 0; lVar5 < (pCVar2->m_nodes).m_size; lVar5 = lVar5 + 1) {
        pNVar3 = (pCVar2->m_nodes).m_data[lVar5];
        if (0.0 < pNVar3->m_im) {
          local_40 = operator-(&pNVar3->m_q,&pCVar2->m_com);
          local_60 = btVector3::cross(&pCVar2->m_av,&local_40);
          local_50 = operator+(&pCVar2->m_lv,&local_60);
          bVar6 = btVector3::length2(&local_50);
          this_00 = &pNVar3->m_v;
          bVar7 = btVector3::length2(this_00);
          if (bVar6 <= bVar7) {
            bVar8 = operator-(&local_50,this_00);
            fVar1 = pCVar2->m_ndamping;
            local_60.m_floats[1] = fVar1 * bVar8.m_floats[1];
            local_60.m_floats[0] = fVar1 * bVar8.m_floats[0];
            local_60.m_floats[2] = bVar8.m_floats[2] * fVar1;
            local_60.m_floats[3] = 0.0;
            btVector3::operator+=(this_00,&local_60);
          }
        }
      }
    }
  }
  return;
}

Assistant:

void					btSoftBody::dampClusters()
{
	int i;

	for(i=0;i<m_clusters.size();++i)
	{
		Cluster&	c=*m_clusters[i];	
		if(c.m_ndamping>0)
		{
			for(int j=0;j<c.m_nodes.size();++j)
			{
				Node&			n=*c.m_nodes[j];
				if(n.m_im>0)
				{
					const btVector3	vx=c.m_lv+btCross(c.m_av,c.m_nodes[j]->m_q-c.m_com);
					if(vx.length2()<=n.m_v.length2())
						{
						n.m_v	+=	c.m_ndamping*(vx-n.m_v);
						}
				}
			}
		}
	}
}